

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternClip.cpp
# Opt level: O3

void __thiscall PatternClip::save(PatternClip *this,Pattern *src,PatternSelection region)

{
  _Head_base<0UL,_char_*,_false> _Var1;
  bool bVar2;
  int track;
  uint uVar3;
  _Head_base<0UL,_char_*,_false> __s;
  TrackRow *pTVar4;
  unsigned_long __n2;
  long lVar5;
  long lVar6;
  ulong __n;
  char *__dest;
  TrackMeta TVar7;
  ChType local_68;
  Iterator local_58;
  size_t local_40;
  Pattern *local_38;
  
  (this->mLocation).mEnd.super_PatternCursorBase.column = region.mEnd.super_PatternCursorBase.column
  ;
  (this->mLocation).mEnd.super_PatternCursorBase.track = region.mEnd.super_PatternCursorBase.track;
  (this->mLocation).mStart.super_PatternCursorBase.row = region.mStart.super_PatternCursorBase.row;
  (this->mLocation).mStart.super_PatternCursorBase.column =
       region.mStart.super_PatternCursorBase.column;
  *(undefined8 *)&(this->mLocation).mStart.super_PatternCursorBase.track = region._8_8_;
  local_38 = src;
  PatternSelection::iterator(&local_58,&this->mLocation);
  local_40 = PatternClipTU::getRowLength(&local_58);
  __n = (long)((local_58.mEnd.super_PatternCursorBase.row -
               local_58.mStart.super_PatternCursorBase.row) + 1) * local_40;
  __s._M_head_impl = (char *)operator_new__(__n);
  memset(__s._M_head_impl,0,__n);
  _Var1._M_head_impl =
       (this->mData)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  (this->mData)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = __s._M_head_impl;
  if (_Var1._M_head_impl != (char *)0x0) {
    operator_delete__(_Var1._M_head_impl);
    __s._M_head_impl =
         (this->mData)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
  }
  track = local_58.mStart.super_PatternCursorBase.track;
  if (local_58.mStart.super_PatternCursorBase.track <= local_58.mEnd.super_PatternCursorBase.track)
  {
    do {
      TVar7 = PatternSelection::Iterator::getTrackMeta(&local_58,track);
      lVar6 = 6;
      if (((undefined1  [16])TVar7 & (undefined1  [16])0xfffffffc) == (undefined1  [16])0x0) {
        lVar6 = *(long *)(&DAT_001b2bd0 + (ulong)(TVar7.mStart & 3) * 8);
      }
      lVar5 = 8;
      if (TVar7.mEnd < 4) {
        uVar3 = TVar7.mEnd + 1;
        lVar5 = 6;
        if (uVar3 < 4) {
          lVar5 = *(long *)(&DAT_001b2bd0 + (ulong)uVar3 * 8);
        }
      }
      if (local_58.mStart.super_PatternCursorBase.row <= local_58.mEnd.super_PatternCursorBase.row)
      {
        local_68 = (ChType)track;
        __dest = __s._M_head_impl;
        uVar3 = local_58.mStart.super_PatternCursorBase.row;
        do {
          pTVar4 = trackerboy::Pattern::getTrackRow(local_38,local_68,uVar3 & 0xffff);
          if (lVar5 != lVar6) {
            memmove(__dest,(void *)((long)((pTVar4->effects)._M_elems + -1) + lVar6),lVar5 - lVar6);
          }
          __dest = __dest + local_40;
          bVar2 = (int)uVar3 < local_58.mEnd.super_PatternCursorBase.row;
          uVar3 = uVar3 + 1;
        } while (bVar2);
      }
      __s._M_head_impl = __s._M_head_impl + (lVar5 - lVar6);
      bVar2 = track < local_58.mEnd.super_PatternCursorBase.track;
      track = track + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void PatternClip::save(trackerboy::Pattern const& src, PatternSelection region) {

    // before we do anything, check that the selection is within the bounds
    // of the given pattern
    #ifndef QT_NO_DEBUG
    {
        auto start = region.start();
        auto end = region.end();

        Q_ASSERT(start.isValid());
        Q_ASSERT(end.isValid());
        Q_ASSERT(start.row < src.size());
        Q_ASSERT(end.row < src.size());
    }
    #endif


    mLocation = region;
    auto const iter = mLocation.iterator();

    // determine the row length
    auto const rowLength = TU::getRowLength(iter);

    auto const bufsize = rowLength * iter.rows();
    Q_ASSERT(bufsize != 0);
    mData = std::make_unique<char[]>(bufsize);

    auto bufAtRowStart = mData.get();
    for (auto track = iter.trackStart(); track <= iter.trackEnd(); ++track) {
        auto const tmeta = iter.getTrackMeta(track);
        auto const offset = TU::columnToOffset(tmeta.columnStart());
        auto const length = TU::columnToLength(tmeta.columnEnd()) - offset;
        // with this assertion passing, we will never read or write past
        // the bounds of a TrackRow
        Q_ASSERT(offset + length <= sizeof(trackerboy::TrackRow));
        Q_ASSERT(length > 0); // if the length is 0 we aren't copying anything, consider this an error

        auto bufAtTrackStart = bufAtRowStart;
        for (int row = iter.rowStart(); row <= iter.rowEnd(); ++row) {
            auto &rowdata = src.getTrackRow(static_cast<trackerboy::ChType>(track), (uint16_t)row);
            std::copy_n(reinterpret_cast<const char*>(&rowdata) + offset, length, bufAtTrackStart);
            // advance to next row
            bufAtTrackStart += rowLength;
        }

        // advance to next track
        bufAtRowStart += length;
    }
}